

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O0

void enet_host_bandwidth_throttle(ENetHost *host)

{
  long lVar1;
  enet_uint32 eVar2;
  uint uVar3;
  uint32_t uVar4;
  long in_RDI;
  bool bVar5;
  enet_uint32 peerBandwidth;
  int i;
  ENetProtocol command;
  ENetPeer *peer;
  int needsAdjustment;
  enet_uint32 bandwidthLimit;
  enet_uint32 throttle;
  enet_uint32 bandwidth;
  enet_uint32 dataTotal;
  enet_uint32 peersRemaining;
  enet_uint32 elapsedTime;
  enet_uint32 timeCurrent;
  ushort in_stack_ffffffffffffff92;
  ushort uVar6;
  ushort length;
  uint in_stack_ffffffffffffff94;
  int iVar7;
  undefined2 in_stack_ffffffffffffff9c;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined2 in_stack_ffffffffffffffa0;
  undefined2 uVar10;
  undefined2 uVar11;
  undefined6 in_stack_ffffffffffffffaa;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14;
  
  eVar2 = enet_time_get();
  uVar3 = eVar2 - *(int *)(in_RDI + 0x14);
  local_14 = (uint)*(undefined8 *)(in_RDI + 0x2b28);
  local_18 = 0xffffffff;
  local_1c = 0xffffffff;
  local_24 = 0;
  bVar5 = *(long *)(in_RDI + 0x2b30) != 0;
  if ((999 < uVar3) && (*(enet_uint32 *)(in_RDI + 0x14) = eVar2, local_14 != 0)) {
    if (*(int *)(in_RDI + 0x10) != 0) {
      local_18 = 0;
      local_1c = (*(int *)(in_RDI + 0x10) * uVar3) / 1000;
      for (iVar7 = 0; (ulong)(long)iVar7 < *(ulong *)(in_RDI + 0x30); iVar7 = iVar7 + 1) {
        lVar1 = *(long *)(*(long *)(in_RDI + 0x28) + (long)iVar7 * 8);
        if ((*(int *)(lVar1 + 0x38) == 5) || (*(int *)(lVar1 + 0x38) == 6)) {
          local_18 = *(int *)(lVar1 + 100) + local_18;
        }
      }
    }
    while( true ) {
      length = in_stack_ffffffffffffff92 & 0xff;
      if (local_14 != 0) {
        length = CONCAT11(bVar5,(char)in_stack_ffffffffffffff92);
      }
      if ((char)(length >> 8) == '\0') break;
      bVar5 = false;
      if (local_1c < local_18) {
        local_20 = (local_1c << 5) / local_18;
      }
      else {
        local_20 = 0x20;
      }
      for (iVar7 = 0; in_stack_ffffffffffffff92 = length,
          (ulong)(long)iVar7 < *(ulong *)(in_RDI + 0x30); iVar7 = iVar7 + 1) {
        lVar1 = *(long *)(*(long *)(in_RDI + 0x28) + (long)iVar7 * 8);
        if ((((*(int *)(lVar1 + 0x38) == 5) || (*(int *)(lVar1 + 0x38) == 6)) &&
            (*(int *)(lVar1 + 0x50) != 0)) &&
           ((*(enet_uint32 *)(lVar1 + 0x5c) != eVar2 &&
            (in_stack_ffffffffffffff94 = (*(int *)(lVar1 + 0x50) * uVar3) / 1000,
            in_stack_ffffffffffffff94 < local_20 * *(int *)(lVar1 + 100) >> 5)))) {
          *(uint *)(lVar1 + 0x90) = (in_stack_ffffffffffffff94 << 5) / *(uint *)(lVar1 + 100);
          if (*(int *)(lVar1 + 0x90) == 0) {
            *(undefined4 *)(lVar1 + 0x90) = 1;
          }
          if (*(uint *)(lVar1 + 0x90) < *(uint *)(lVar1 + 0x8c)) {
            *(undefined4 *)(lVar1 + 0x8c) = *(undefined4 *)(lVar1 + 0x90);
          }
          *(enet_uint32 *)(lVar1 + 0x5c) = eVar2;
          *(undefined4 *)(lVar1 + 0x60) = 0;
          *(undefined4 *)(lVar1 + 100) = 0;
          bVar5 = true;
          local_14 = local_14 + -1;
          local_1c = local_1c - in_stack_ffffffffffffff94;
          local_18 = local_18 - in_stack_ffffffffffffff94;
        }
      }
    }
    if (local_14 != 0) {
      if (local_1c < local_18) {
        local_20 = (local_1c << 5) / local_18;
      }
      else {
        local_20 = 0x20;
      }
      for (iVar7 = 0; (ulong)(long)iVar7 < *(ulong *)(in_RDI + 0x30); iVar7 = iVar7 + 1) {
        lVar1 = *(long *)(*(long *)(in_RDI + 0x28) + (long)iVar7 * 8);
        if (((*(int *)(lVar1 + 0x38) == 5) || (*(int *)(lVar1 + 0x38) == 6)) &&
           (*(enet_uint32 *)(lVar1 + 0x5c) != eVar2)) {
          *(uint *)(lVar1 + 0x90) = local_20;
          if (*(uint *)(lVar1 + 0x90) < *(uint *)(lVar1 + 0x8c)) {
            *(undefined4 *)(lVar1 + 0x8c) = *(undefined4 *)(lVar1 + 0x90);
          }
          *(undefined4 *)(lVar1 + 0x60) = 0;
          *(undefined4 *)(lVar1 + 100) = 0;
        }
      }
    }
    if (*(int *)(in_RDI + 0x20) != 0) {
      *(undefined4 *)(in_RDI + 0x20) = 0;
      local_14 = (uint)*(undefined8 *)(in_RDI + 0x2b28);
      local_1c = *(uint *)(in_RDI + 0xc);
      uVar8 = 1;
      uVar6 = length;
      if (local_1c == 0) {
        local_24 = 0;
      }
      else {
        while( true ) {
          length = uVar6 & 0xff00;
          if (local_14 != 0) {
            length = CONCAT11((char)(uVar6 >> 8),uVar8);
          }
          if ((char)length == '\0') break;
          uVar8 = 0;
          local_24 = local_1c / local_14;
          for (iVar7 = 0; uVar6 = length, (ulong)(long)iVar7 < *(ulong *)(in_RDI + 0x30);
              iVar7 = iVar7 + 1) {
            lVar1 = *(long *)(*(long *)(in_RDI + 0x28) + (long)iVar7 * 8);
            if (((*(int *)(lVar1 + 0x38) == 5) || (*(int *)(lVar1 + 0x38) == 6)) &&
               ((*(enet_uint32 *)(lVar1 + 0x58) != eVar2 &&
                ((*(int *)(lVar1 + 0x54) == 0 || (*(uint *)(lVar1 + 0x54) < local_24)))))) {
              *(enet_uint32 *)(lVar1 + 0x58) = eVar2;
              uVar8 = 1;
              local_14 = local_14 - 1;
              local_1c = local_1c - *(int *)(lVar1 + 0x54);
            }
          }
        }
      }
      for (iVar7 = 0; (ulong)(long)iVar7 < *(ulong *)(in_RDI + 0x30); iVar7 = iVar7 + 1) {
        lVar1 = *(long *)(*(long *)(in_RDI + 0x28) + (long)iVar7 * 8);
        if ((*(int *)(lVar1 + 0x38) == 5) || (*(int *)(lVar1 + 0x38) == 6)) {
          uVar8 = 0x8a;
          uVar9 = 0xff;
          uVar4 = htonl(*(uint32_t *)(in_RDI + 0x10));
          uVar10 = (undefined2)uVar4;
          uVar11 = (undefined2)(uVar4 >> 0x10);
          if (*(enet_uint32 *)(lVar1 + 0x58) == eVar2) {
            uVar4 = htonl(*(uint32_t *)(lVar1 + 0x54));
          }
          else {
            uVar4 = htonl(local_24);
          }
          enet_peer_queue_outgoing_command
                    ((ENetPeer *)CONCAT62(in_stack_ffffffffffffffaa,uVar11),
                     (ENetProtocol *)CONCAT26(uVar10,CONCAT42(uVar4,in_stack_ffffffffffffffa0)),
                     (ENetPacket *)
                     CONCAT17(uVar9,CONCAT16(uVar8,CONCAT24(in_stack_ffffffffffffff9c,iVar7))),
                     in_stack_ffffffffffffff94,length);
        }
      }
    }
  }
  return;
}

Assistant:

void
enet_host_bandwidth_throttle (ENetHost * host)
{
    enet_uint32 timeCurrent = enet_time_get (),
           elapsedTime = timeCurrent - host -> bandwidthThrottleEpoch,
           peersRemaining = (enet_uint32) host -> connectedPeers,
           dataTotal = ~0,
           bandwidth = ~0,
           throttle = 0,
           bandwidthLimit = 0;
    int needsAdjustment = host -> bandwidthLimitedPeers > 0 ? 1 : 0;
    ENetPeer * peer;
    ENetProtocol command;
    int i;

    if (elapsedTime < ENET_HOST_BANDWIDTH_THROTTLE_INTERVAL)
      return;

    host -> bandwidthThrottleEpoch = timeCurrent;

    if (peersRemaining == 0)
      return;

    if (host -> outgoingBandwidth != 0)
    {
        dataTotal = 0;
        bandwidth = (host -> outgoingBandwidth * elapsedTime) / 1000;

	for (i = 0; i < host -> peerCount; i++ )
        {
	    peer = host -> peer_list[i];

            if (peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER)
              continue;

            dataTotal += peer -> outgoingDataTotal;
        }
    }

    while (peersRemaining > 0 && needsAdjustment != 0)
    {
        needsAdjustment = 0;
        
        if (dataTotal <= bandwidth)
          throttle = ENET_PEER_PACKET_THROTTLE_SCALE;
        else
          throttle = (bandwidth * ENET_PEER_PACKET_THROTTLE_SCALE) / dataTotal;

	for (i = 0; i < host -> peerCount; i++ )
	{
            enet_uint32 peerBandwidth;
	    peer = host -> peer_list[i];
            
            if ((peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER) ||
                peer -> incomingBandwidth == 0 ||
                peer -> outgoingBandwidthThrottleEpoch == timeCurrent)
              continue;

            peerBandwidth = (peer -> incomingBandwidth * elapsedTime) / 1000;
            if ((throttle * peer -> outgoingDataTotal) / ENET_PEER_PACKET_THROTTLE_SCALE <= peerBandwidth)
              continue;

            peer -> packetThrottleLimit = (peerBandwidth * 
                                            ENET_PEER_PACKET_THROTTLE_SCALE) / peer -> outgoingDataTotal;
            
            if (peer -> packetThrottleLimit == 0)
              peer -> packetThrottleLimit = 1;
            
            if (peer -> packetThrottle > peer -> packetThrottleLimit)
              peer -> packetThrottle = peer -> packetThrottleLimit;

            peer -> outgoingBandwidthThrottleEpoch = timeCurrent;

            peer -> incomingDataTotal = 0;
            peer -> outgoingDataTotal = 0;

            needsAdjustment = 1;
            -- peersRemaining;
            bandwidth -= peerBandwidth;
            dataTotal -= peerBandwidth;
        }
    }

    if (peersRemaining > 0)
    {
        if (dataTotal <= bandwidth)
          throttle = ENET_PEER_PACKET_THROTTLE_SCALE;
        else
          throttle = (bandwidth * ENET_PEER_PACKET_THROTTLE_SCALE) / dataTotal;

	for (i = 0; i < host -> peerCount; i++ )
	{
	    peer = host -> peer_list[i];

            if ((peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER) ||
		peer -> outgoingBandwidthThrottleEpoch == timeCurrent)
	      continue;

	    peer -> packetThrottleLimit = throttle;

	    if (peer -> packetThrottle > peer -> packetThrottleLimit)
		peer -> packetThrottle = peer -> packetThrottleLimit;

            peer -> incomingDataTotal = 0;
            peer -> outgoingDataTotal = 0;
	}
    }

    if (host -> recalculateBandwidthLimits)
    {
       host -> recalculateBandwidthLimits = 0;

       peersRemaining = (enet_uint32) host -> connectedPeers;
       bandwidth = host -> incomingBandwidth;
       needsAdjustment = 1;

       if (bandwidth == 0)
         bandwidthLimit = 0;
       else
       while (peersRemaining > 0 && needsAdjustment != 0)
       {
           needsAdjustment = 0;
           bandwidthLimit = bandwidth / peersRemaining;

	   for (i = 0; i < host -> peerCount; i++ )
	   {
	       peer = host -> peer_list[i];
               if ((peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER) ||
                   peer -> incomingBandwidthThrottleEpoch == timeCurrent)
                 continue;

               if (peer -> outgoingBandwidth > 0 &&
                   peer -> outgoingBandwidth >= bandwidthLimit)
                 continue;

               peer -> incomingBandwidthThrottleEpoch = timeCurrent;
 
               needsAdjustment = 1;
               -- peersRemaining;
               bandwidth -= peer -> outgoingBandwidth;
           }
       }

       for (i = 0; i < host -> peerCount; i++ )
       {
	   peer = host -> peer_list[i];

           if (peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER)
             continue;

           command.header.command = ENET_PROTOCOL_COMMAND_BANDWIDTH_LIMIT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
           command.header.channelID = 0xFF;
           command.bandwidthLimit.outgoingBandwidth = ENET_HOST_TO_NET_32 (host -> outgoingBandwidth);

           if (peer -> incomingBandwidthThrottleEpoch == timeCurrent)
             command.bandwidthLimit.incomingBandwidth = ENET_HOST_TO_NET_32 (peer -> outgoingBandwidth);
           else
             command.bandwidthLimit.incomingBandwidth = ENET_HOST_TO_NET_32 (bandwidthLimit);

           enet_peer_queue_outgoing_command (peer, & command, NULL, 0, 0);
       } 
    }
}